

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O0

Option * __thiscall CLI::Option::capture_default_str(Option *this)

{
  bool bVar1;
  Option *in_RDI;
  function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
  *in_stack_ffffffffffffffd8;
  
  bVar1 = ::std::function::operator_cast_to_bool
                    ((function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
                      *)0x14ca8f);
  if (bVar1) {
    std::
    function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>::
    operator()(in_stack_ffffffffffffffd8);
    ::std::__cxx11::string::operator=
              ((string *)&in_RDI->default_str_,(string *)&stack0xffffffffffffffd8);
    ::std::__cxx11::string::~string((string *)&stack0xffffffffffffffd8);
  }
  return in_RDI;
}

Assistant:

Option *capture_default_str() {
        if(default_function_) {
            default_str_ = default_function_();
        }
        return this;
    }